

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comment_on_column_info.cpp
# Opt level: O1

void __thiscall duckdb::SetColumnCommentInfo::SetColumnCommentInfo(SetColumnCommentInfo *this)

{
  char *__end;
  LogicalType local_a0;
  string local_88;
  string local_68;
  string local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,anon_var_dwarf_63b5960 + 9,anon_var_dwarf_63b5960 + 9);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,anon_var_dwarf_63b5960 + 9,anon_var_dwarf_63b5960 + 9);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,anon_var_dwarf_63b5960 + 9);
  AlterInfo::AlterInfo
            (&this->super_AlterInfo,SET_COLUMN_COMMENT,&local_68,&local_88,&local_48,THROW_EXCEPTION
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__SetColumnCommentInfo_02492248;
  (this->super_AlterInfo).field_0x71 = 0;
  (this->column_name)._M_dataplus._M_p = (pointer)&(this->column_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->column_name,anon_var_dwarf_63b5960 + 9);
  LogicalType::LogicalType(&local_a0,SQLNULL);
  Value::Value(&this->comment_value,&local_a0);
  LogicalType::~LogicalType(&local_a0);
  return;
}

Assistant:

SetColumnCommentInfo::SetColumnCommentInfo()
    : AlterInfo(AlterType::SET_COLUMN_COMMENT, INVALID_CATALOG, INVALID_SCHEMA, "", OnEntryNotFound::THROW_EXCEPTION),
      catalog_entry_type(CatalogType::INVALID), column_name(""), comment_value(Value()) {
}